

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

void Curl_hostcache_prune(SessionHandle *data)

{
  time_t local_18;
  time_t now;
  SessionHandle *data_local;
  
  if (((data->set).dns_cache_timeout != -1) && ((data->dns).hostcache != (curl_hash *)0x0)) {
    now = (time_t)data;
    if (data->share != (Curl_share *)0x0) {
      Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
    }
    time(&local_18);
    hostcache_prune(*(curl_hash **)(now + 0x50),*(long *)(now + 0x438),local_18);
    if (*(long *)(now + 0x70) != 0) {
      Curl_share_unlock((SessionHandle *)now,CURL_LOCK_DATA_DNS);
    }
  }
  return;
}

Assistant:

void Curl_hostcache_prune(struct SessionHandle *data)
{
  time_t now;

  if((data->set.dns_cache_timeout == -1) || !data->dns.hostcache)
    /* cache forever means never prune, and NULL hostcache means
       we can't do it */
    return;

  if(data->share)
    Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

  time(&now);

  /* Remove outdated and unused entries from the hostcache */
  hostcache_prune(data->dns.hostcache,
                  data->set.dns_cache_timeout,
                  now);

  if(data->share)
    Curl_share_unlock(data, CURL_LOCK_DATA_DNS);
}